

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_client_alloc(nng_http_client **clip,nng_url *url)

{
  nng_err nVar1;
  nng_url *url_local;
  nng_http_client **clip_local;
  
  nVar1 = nni_http_client_init(clip,url);
  return nVar1;
}

Assistant:

nng_err
nng_http_client_alloc(nng_http_client **clip, const nng_url *url)
{
#ifdef NNG_SUPP_HTTP
	return (nni_http_client_init(clip, url));
#else
	NNI_ARG_UNUSED(clip);
	NNI_ARG_UNUSED(url);
	return (NNG_ENOTSUP);
#endif
}